

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackOverflowQueryTests.cpp
# Opt level: O1

IterateResult __thiscall
gl3cts::TransformFeedbackOverflowQueryErrorInvalidIndex::iterate
          (TransformFeedbackOverflowQueryErrorInvalidIndex *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  uint uVar4;
  GLint value;
  undefined1 local_24 [4];
  long lVar3;
  
  iVar2 = (*((this->super_TransformFeedbackOverflowQueryErrorBase).
             super_TransformFeedbackOverflowQueryBaseTest.super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  (this->super_TransformFeedbackOverflowQueryErrorBase).m_case_name =
       "GetQueryIndexediv must generate INVALID_VALUE if <target> is TRANSFORM_FEEDBACK_OVERFLOW_ARB and <index> is non-zero."
  ;
  if (1 < (this->super_TransformFeedbackOverflowQueryErrorBase).
          super_TransformFeedbackOverflowQueryBaseTest.m_max_vertex_streams) {
    uVar4 = 1;
    do {
      (**(code **)(lVar3 + 0xa00))(0x82ec,uVar4,0x8865,local_24);
      TransformFeedbackOverflowQueryErrorBase::verifyError
                (&this->super_TransformFeedbackOverflowQueryErrorBase,0x501);
      uVar4 = uVar4 + 1;
    } while (uVar4 < (this->super_TransformFeedbackOverflowQueryErrorBase).
                     super_TransformFeedbackOverflowQueryBaseTest.m_max_vertex_streams);
  }
  bVar1 = TransformFeedbackOverflowQueryBaseTest::supportsTransformFeedback3
                    ((TransformFeedbackOverflowQueryBaseTest *)this);
  if (bVar1) {
    (this->super_TransformFeedbackOverflowQueryErrorBase).m_case_name =
         "GetQueryIndexediv must generate INVALID_VALUE if <target> is TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB and <index> is greater than or equal to MAX_VERTEX_STREAMS."
    ;
    uVar4 = (this->super_TransformFeedbackOverflowQueryErrorBase).
            super_TransformFeedbackOverflowQueryBaseTest.m_max_vertex_streams;
    if (uVar4 < 0xfffffffc) {
      do {
        (**(code **)(lVar3 + 0xa00))(0x82ed,uVar4,0x8865,local_24);
        TransformFeedbackOverflowQueryErrorBase::verifyError
                  (&this->super_TransformFeedbackOverflowQueryErrorBase,0x501);
        uVar4 = uVar4 + 1;
      } while (uVar4 < (this->super_TransformFeedbackOverflowQueryErrorBase).
                       super_TransformFeedbackOverflowQueryBaseTest.m_max_vertex_streams + 4);
    }
  }
  (this->super_TransformFeedbackOverflowQueryErrorBase).m_case_name =
       "BeginQueryIndexed must generate INVALID_VALUE if <target> is TRANSFORM_FEEDBACK_OVERFLOW_ARB and <index> is non-zero."
  ;
  if (1 < (this->super_TransformFeedbackOverflowQueryErrorBase).
          super_TransformFeedbackOverflowQueryBaseTest.m_max_vertex_streams) {
    uVar4 = 1;
    do {
      (**(code **)(lVar3 + 0x28))(0x82ec,uVar4,this->m_query);
      TransformFeedbackOverflowQueryErrorBase::verifyError
                (&this->super_TransformFeedbackOverflowQueryErrorBase,0x501);
      uVar4 = uVar4 + 1;
    } while (uVar4 < (this->super_TransformFeedbackOverflowQueryErrorBase).
                     super_TransformFeedbackOverflowQueryBaseTest.m_max_vertex_streams);
  }
  bVar1 = TransformFeedbackOverflowQueryBaseTest::supportsTransformFeedback3
                    ((TransformFeedbackOverflowQueryBaseTest *)this);
  if (bVar1) {
    (this->super_TransformFeedbackOverflowQueryErrorBase).m_case_name =
         "BeginQueryIndexed must generate INVALID_VALUE if <target> is TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB and <index> is greater than or equal to MAX_VERTEX_STREAMS."
    ;
    uVar4 = (this->super_TransformFeedbackOverflowQueryErrorBase).
            super_TransformFeedbackOverflowQueryBaseTest.m_max_vertex_streams;
    if (uVar4 < 0xfffffffc) {
      do {
        (**(code **)(lVar3 + 0x28))(0x82ed,uVar4,this->m_query);
        TransformFeedbackOverflowQueryErrorBase::verifyError
                  (&this->super_TransformFeedbackOverflowQueryErrorBase,0x501);
        uVar4 = uVar4 + 1;
      } while (uVar4 < (this->super_TransformFeedbackOverflowQueryErrorBase).
                       super_TransformFeedbackOverflowQueryBaseTest.m_max_vertex_streams + 4);
    }
  }
  tcu::TestContext::setTestResult
            ((this->super_TransformFeedbackOverflowQueryErrorBase).
             super_TransformFeedbackOverflowQueryBaseTest.super_TestCase.super_TestCase.
             super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  return STOP;
}

Assistant:

IterateResult iterate()
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();
		GLint				  value;

		startTest("GetQueryIndexediv must generate INVALID_VALUE if <target> is "
				  "TRANSFORM_FEEDBACK_OVERFLOW_ARB and <index> is non-zero.");

		for (GLuint i = 1; i < getMaxVertexStreams(); ++i)
		{
			gl.getQueryIndexediv(GL_TRANSFORM_FEEDBACK_OVERFLOW_ARB, i, GL_CURRENT_QUERY, &value);
			verifyError(GL_INVALID_VALUE);
		}

		if (supportsTransformFeedback3())
		{
			startTest("GetQueryIndexediv must generate INVALID_VALUE if <target> is "
					  "TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB and <index> is greater "
					  "than or equal to MAX_VERTEX_STREAMS.");

			for (GLuint i = getMaxVertexStreams(); i < getMaxVertexStreams() + 4; ++i)
			{
				gl.getQueryIndexediv(GL_TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB, i, GL_CURRENT_QUERY, &value);
				verifyError(GL_INVALID_VALUE);
			}
		}

		startTest("BeginQueryIndexed must generate INVALID_VALUE if <target> is "
				  "TRANSFORM_FEEDBACK_OVERFLOW_ARB and <index> is non-zero.");

		for (GLuint i = 1; i < getMaxVertexStreams(); ++i)
		{
			gl.beginQueryIndexed(GL_TRANSFORM_FEEDBACK_OVERFLOW_ARB, i, m_query);
			verifyError(GL_INVALID_VALUE);
		}

		if (supportsTransformFeedback3())
		{
			startTest("BeginQueryIndexed must generate INVALID_VALUE if <target> is "
					  "TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB and <index> is greater "
					  "than or equal to MAX_VERTEX_STREAMS.");

			for (GLuint i = getMaxVertexStreams(); i < getMaxVertexStreams() + 4; ++i)
			{
				gl.beginQueryIndexed(GL_TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB, i, m_query);
				verifyError(GL_INVALID_VALUE);
			}
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

		return STOP;
	}